

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restarts.cc
# Opt level: O1

void __thiscall gss::LubyRestartsSchedule::did_a_restart(LubyRestartsSchedule *this)

{
  list<long_long,_std::allocator<long_long>_> *__position;
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  __position = &this->_sequence;
  if (((this->_current_sequence)._M_node)->_M_next == (_List_node_base *)__position) {
    std::__cxx11::list<long_long,std::allocator<long_long>>::
    insert<std::_List_iterator<long_long>,void>
              ((list<long_long,std::allocator<long_long>> *)__position,(const_iterator)__position,
               (this->_sequence).super__List_base<long_long,_std::allocator<long_long>_>._M_impl.
               _M_node.super__List_node_base._M_next,(_List_iterator<long_long>)__position);
    p_Var2 = (this->_sequence).super__List_base<long_long,_std::allocator<long_long>_>._M_impl.
             _M_node.super__List_node_base._M_prev[1]._M_next;
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)((long)p_Var2 * 2);
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->_sequence).super__List_base<long_long,_std::allocator<long_long>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var2 = ((this->_current_sequence)._M_node)->_M_next;
  (this->_current_sequence)._M_node = p_Var2;
  this->_backtracks_remaining = (longlong)p_Var2[1]._M_next;
  return;
}

Assistant:

auto LubyRestartsSchedule::did_a_restart() -> void
{
    if (next(_current_sequence) == _sequence.end()) {
        _sequence.insert(_sequence.end(), _sequence.begin(), _sequence.end());
        _sequence.push_back(_sequence.back() * 2);
    }
    ++_current_sequence;
    _backtracks_remaining = *_current_sequence;
}